

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prox.cpp
# Opt level: O3

void lts2::ProxLinf(Mat *X,float radius)

{
  float fVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long *local_30 [2];
  long local_20 [2];
  
  lVar4 = *(long *)(X + 0x10);
  if ((lVar4 != 0) && ((*(uint *)X & 7) == 5)) {
    iVar2 = *(int *)(X + 8);
    if (0 < (long)iVar2) {
      lVar3 = **(long **)(X + 0x48);
      iVar6 = ((*(uint *)X >> 3 & 0x1ff) + 1) * *(int *)(X + 0xc);
      lVar7 = 0;
      do {
        if (0 < iVar6) {
          lVar8 = 0;
          do {
            fVar1 = *(float *)(lVar4 + lVar8 * 4);
            if (radius < ABS(fVar1)) {
              uVar9 = -(uint)(0.0 < fVar1);
              *(uint *)(lVar4 + lVar8 * 4) = ~uVar9 & (uint)-radius | uVar9 & (uint)radius;
            }
            lVar8 = lVar8 + 1;
          } while (iVar6 != (int)lVar8);
        }
        lVar7 = lVar7 + 1;
        lVar4 = lVar4 + lVar3;
      } while (lVar7 != iVar2);
    }
    return;
  }
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_30,"X.data && X.depth() == CV_32F","");
  uVar5 = cv::error(-0xd7,(string *)local_30,"ProxLinf",
                    "/workspace/llm4binary/github/license_c_cmakelists/sansuiso[P]LBDReconstruction/src/LBDReconstruction/prox.cpp"
                    ,0x31);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void lts2::ProxLinf(cv::Mat& X, float radius)
{
  CV_Assert(X.data && X.depth() == CV_32F);

#ifdef WITH_DISPATCH
  // Get a queue
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);

  // Parallel loop over the rows
  float* p_imageData = X.ptr<float>(0);

  dispatch_apply(X.rows, queue,
                 ^(size_t y) {
                   float *p_x = X.ptr<float>(y);
                   
                   for (int x = 0; x < X.channels()*X.cols; ++x, ++p_x) {
                     if (std::fabs(*p_x) > radius) {
                       if (*p_x > 0.0)
                         *p_x = radius;
                       else
                         *p_x = -radius;
                     }
                   }
                 });    
#else
  for (int y = 0; y < X.rows; ++y)
  {
    float* p_x = X.ptr<float>(y);
    
    for (int x = 0; x < X.cols*X.channels(); ++x, ++p_x)
    {
      float abs_x = std::fabs(*p_x);
      if (abs_x > radius) {
        if (*p_x > 0.0) 
          *p_x = radius;
        else
        *p_x = -radius;
      }
    }
  }
#endif
}